

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_6::TwoLevelIterator::SetDataIterator
          (TwoLevelIterator *this,Iterator *data_iter)

{
  char *pcVar1;
  long in_FS_OFFSET;
  Iterator *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->data_iter_).iter_ != (Iterator *)0x0) {
    IteratorWrapper::status((IteratorWrapper *)&local_28);
    if ((this->status_).state_ == (char *)0x0) {
      if (local_28 == (Iterator *)0x0) goto LAB_00675208;
      pcVar1 = Status::CopyState((char *)local_28);
      (this->status_).state_ = pcVar1;
    }
    if (local_28 != (Iterator *)0x0) {
      operator_delete__(local_28);
    }
  }
LAB_00675208:
  IteratorWrapper::Set(&this->data_iter_,data_iter);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TwoLevelIterator::SetDataIterator(Iterator* data_iter) {
  if (data_iter_.iter() != nullptr) SaveError(data_iter_.status());
  data_iter_.Set(data_iter);
}